

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

void lua_sethook(lua_State *L,lua_Hook func,int mask,int count)

{
  uint uVar1;
  lua_Hook p_Var2;
  
  if ((L->ci->callstatus & 2) != 0) {
    L->oldpc = (L->ci->u).l.savedpc;
  }
  p_Var2 = func;
  if (mask == 0) {
    p_Var2 = (lua_Hook)0x0;
  }
  L->hook = p_Var2;
  L->basehookcount = count;
  L->hookcount = count;
  uVar1 = mask & 0xff;
  if (func == (lua_Hook)0x0) {
    uVar1 = 0;
  }
  L->hookmask = uVar1;
  return;
}

Assistant:

LUA_API void lua_sethook (lua_State *L, lua_Hook func, int mask, int count) {
  if (func == NULL || mask == 0) {  /* turn off hooks? */
    mask = 0;
    func = NULL;
  }
  if (isLua(L->ci))
    L->oldpc = L->ci->u.l.savedpc;
  L->hook = func;
  L->basehookcount = count;
  resethookcount(L);
  L->hookmask = cast_byte(mask);
}